

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

void crnlib::LzmaEnc_FastPosInit(Byte *g_FastPos)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  g_FastPos[0] = '\0';
  g_FastPos[1] = '\x01';
  uVar2 = 2;
  lVar3 = 2;
  do {
    lVar3 = (long)(int)lVar3;
    uVar4 = 1;
    do {
      g_FastPos[lVar3] = (Byte)uVar2;
      lVar3 = lVar3 + 1;
      uVar1 = uVar4 >> ((char)(uVar2 >> 1) - 1U & 0x1f);
      uVar4 = uVar4 + 1;
    } while (uVar1 == 0);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x1a);
  return;
}

Assistant:

void LzmaEnc_FastPosInit(Byte* g_FastPos) {
  int c = 2, slotFast;
  g_FastPos[0] = 0;
  g_FastPos[1] = 1;

  for (slotFast = 2; slotFast < kNumLogBits * 2; slotFast++) {
    UInt32 k = (1 << ((slotFast >> 1) - 1));
    UInt32 j;
    for (j = 0; j < k; j++, c++)
      g_FastPos[c] = (Byte)slotFast;
  }
}